

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O3

void __thiscall
Pl_PNGFilter::Pl_PNGFilter
          (Pl_PNGFilter *this,char *identifier,Pipeline *next,action_e action,uint columns,
          uint samples_per_pixel,uint bits_per_sample)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *peVar3;
  runtime_error *prVar4;
  code *pcVar5;
  undefined *puVar6;
  uint uVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_PNGFilter_002f56a0;
  this->action = action;
  this->cur_row = (uchar *)0x0;
  this->prev_row = (uchar *)0x0;
  (this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->pos = 0;
  this->incoming = 0;
  if (next == (Pipeline *)0x0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)prVar4,"Attempt to create Pl_PNGFilter with nullptr as next");
    pcVar5 = std::logic_error::~logic_error;
    puVar6 = &std::logic_error::typeinfo;
  }
  else {
    if (samples_per_pixel == 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"PNGFilter created with invalid samples_per_pixel");
    }
    else {
      if ((bits_per_sample < 0x11) && ((0x10116U >> (bits_per_sample & 0x1f) & 1) != 0)) {
        this->bytes_per_pixel = bits_per_sample * samples_per_pixel + 7 >> 3;
        uVar7 = bits_per_sample * samples_per_pixel * columns + 7;
        if (uVar7 < 8) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"PNGFilter created with invalid columns value");
        }
        else {
          uVar7 = uVar7 >> 3;
          if (((anonymous_namespace)::memory_limit == 0) ||
             ((ulong)uVar7 <= (anonymous_namespace)::memory_limit >> 1)) {
            this->bytes_per_row = uVar7;
            peVar3 = (element_type *)operator_new__((ulong)(uVar7 + 1));
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<unsigned_char*,std::default_delete<unsigned_char[]>,std::allocator<void>,void>
                      (&_Stack_30,peVar3);
            _Var2._M_pi = _Stack_30._M_pi;
            _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var1 = (this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar3;
            (this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = _Var2._M_pi;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
              if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
              }
            }
            peVar3 = (element_type *)operator_new__((ulong)(this->bytes_per_row + 1));
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<unsigned_char*,std::default_delete<unsigned_char[]>,std::allocator<void>,void>
                      ();
            _Var2._M_pi = _Stack_30._M_pi;
            _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var1 = (this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar3;
            (this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = _Var2._M_pi;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
              if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
              }
            }
            memset((this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,0,(ulong)(this->bytes_per_row + 1));
            memset((this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,0,(ulong)(this->bytes_per_row + 1));
            this->cur_row =
                 (this->buf1).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            this->prev_row =
                 (this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            this->incoming = (ulong)((this->bytes_per_row + 1) - (uint)(action == a_encode));
            return;
          }
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"PNGFilter memory limit exceeded");
        }
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,"PNGFilter created with invalid bits_per_sample not 1, 2, 4, 8, or 16");
    }
    pcVar5 = std::runtime_error::~runtime_error;
    puVar6 = &std::runtime_error::typeinfo;
  }
  __cxa_throw(prVar4,puVar6,pcVar5);
}

Assistant:

Pl_PNGFilter::Pl_PNGFilter(
    char const* identifier,
    Pipeline* next,
    action_e action,
    unsigned int columns,
    unsigned int samples_per_pixel,
    unsigned int bits_per_sample) :
    Pipeline(identifier, next),
    action(action)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_PNGFilter with nullptr as next");
    }
    if (samples_per_pixel < 1) {
        throw std::runtime_error("PNGFilter created with invalid samples_per_pixel");
    }
    if (!((bits_per_sample == 1) || (bits_per_sample == 2) || (bits_per_sample == 4) ||
          (bits_per_sample == 8) || (bits_per_sample == 16))) {
        throw std::runtime_error(
            "PNGFilter created with invalid bits_per_sample not 1, 2, 4, 8, or 16");
    }
    this->bytes_per_pixel = ((bits_per_sample * samples_per_pixel) + 7) / 8;
    unsigned long long bpr = ((columns * bits_per_sample * samples_per_pixel) + 7) / 8;
    if ((bpr == 0) || (bpr > (UINT_MAX - 1))) {
        throw std::runtime_error("PNGFilter created with invalid columns value");
    }
    if (memory_limit > 0 && bpr > (memory_limit / 2U)) {
        throw std::runtime_error("PNGFilter memory limit exceeded");
    }
    this->bytes_per_row = bpr & UINT_MAX;
    this->buf1 = QUtil::make_shared_array<unsigned char>(this->bytes_per_row + 1);
    this->buf2 = QUtil::make_shared_array<unsigned char>(this->bytes_per_row + 1);
    memset(this->buf1.get(), 0, this->bytes_per_row + 1);
    memset(this->buf2.get(), 0, this->bytes_per_row + 1);
    this->cur_row = this->buf1.get();
    this->prev_row = this->buf2.get();

    // number of bytes per incoming row
    this->incoming = (action == a_encode ? this->bytes_per_row : this->bytes_per_row + 1);
}